

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_0::BaseCase::render
          (BaseCase *this,RenderData *data,int instances)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x1680))((data->m_program).m_program.m_program);
  (**(code **)(lVar2 + 0xd8))((data->m_vao).super_ObjectWrapper.m_object);
  (**(code **)(lVar2 + 0x548))(4,0,data->m_numVertices,instances);
  (**(code **)(lVar2 + 0xd8))(0);
  return;
}

Assistant:

void BaseCase::render (const RenderData& data, int instances) const
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	gl.useProgram(data.m_program.getProgram());

	gl.bindVertexArray(*data.m_vao);
	gl.drawArraysInstanced(GL_TRIANGLES, 0, data.m_numVertices, instances);
	gl.bindVertexArray(0);
}